

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmgram.cpp
# Opt level: O0

int __thiscall
CVmObjGramProd::getp_parse(CVmObjGramProd *this,vm_obj_id_t self,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  vm_obj_id_t vVar4;
  vm_gram_ext *pvVar5;
  vm_val_t *pvVar6;
  void *pvVar7;
  char *pcVar8;
  undefined8 *puVar9;
  size_t sVar10;
  int *in_RCX;
  vm_val_t *in_RDX;
  undefined4 in_ESI;
  vm_val_t *in_RDI;
  size_t last_tok;
  size_t first_tok;
  vm_val_t tok_match_val;
  vm_val_t tree_val;
  enum_props_ctx ctx;
  char *tokstrp;
  int subcnt;
  vm_val_t tok_str_val;
  vm_val_t tok_typ_val;
  vm_val_t ele_val;
  CVmGramProdMatchEntry *match;
  int succ_cnt;
  CVmObjList *lst;
  CVmGramProdQueue queues;
  int orig_argc;
  vmgramprod_tok *tok;
  int i;
  int tok_cnt;
  CVmObjDict *dict;
  vm_val_t dictval;
  vm_val_t *tokval;
  vm_val_t *in_stack_fffffffffffffe88;
  undefined1 *element_count;
  undefined4 in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe94;
  undefined4 in_stack_fffffffffffffe98;
  undefined4 in_stack_fffffffffffffe9c;
  vm_val_t *in_stack_fffffffffffffea0;
  CVmObjDict *dict_00;
  vm_val_t *in_stack_fffffffffffffea8;
  vm_val_t *in_stack_fffffffffffffeb0;
  vmgramprod_tok *in_stack_fffffffffffffeb8;
  CVmGramProdMem *in_stack_fffffffffffffec0;
  undefined4 in_stack_fffffffffffffed0;
  int iVar11;
  void *in_stack_fffffffffffffee0;
  _func_void_void_ptr_vm_prop_id_t_vm_val_t_ptr *in_stack_fffffffffffffee8;
  CVmObjDict *in_stack_fffffffffffffef0;
  anon_union_8_8_cb74652f_for_val in_stack_fffffffffffffef8;
  vm_val_t *in_stack_ffffffffffffff00;
  vm_val_t *in_stack_ffffffffffffff08;
  vm_gram_ext *in_stack_ffffffffffffff10;
  undefined8 local_d0;
  undefined8 local_c8;
  int local_c0;
  uint in_stack_ffffffffffffff48;
  undefined4 in_stack_ffffffffffffff4c;
  size_t in_stack_ffffffffffffff50;
  size_t in_stack_ffffffffffffff58;
  vmgramprod_tok *in_stack_ffffffffffffff60;
  CVmGramProdMem *in_stack_ffffffffffffff68;
  CVmObjGramProd *in_stack_ffffffffffffff70;
  CVmGramProdMatch *pCVar12;
  CVmGramProdQueue *in_stack_ffffffffffffff80;
  vm_obj_id_t in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff90;
  CVmGramProdMatch *in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffffa0;
  int n;
  int local_50;
  CVmGramProdMem *local_48;
  vm_val_t local_40;
  vm_val_t *local_30;
  vm_val_t *local_20;
  undefined4 local_14;
  
  if (in_RCX == (int *)0x0) {
    iVar11 = 0;
  }
  else {
    iVar11 = *in_RCX;
  }
  n = iVar11;
  local_20 = in_RDX;
  local_14 = in_ESI;
  if ((getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_parse::desc,2);
    __cxa_guard_release(&getp_parse(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    ((vm_val_t *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                     (uint *)CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90),
                     (CVmNativeCodeDesc *)in_stack_fffffffffffffe88);
  if (iVar1 == 0) {
    pvVar5 = get_ext((CVmObjGramProd *)in_RDI);
    CVmGramProdMem::reset(pvVar5->mem_);
    CVmGramProdQueue::clear((CVmGramProdQueue *)&stack0xffffffffffffff88);
    local_30 = CVmStack::get(0);
    iVar1 = vm_val_t::is_listlike(in_stack_fffffffffffffea0);
    if ((iVar1 == 0) ||
       (iVar1 = vm_val_t::ll_length((vm_val_t *)
                                    CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)),
       iVar1 < 0)) {
      err_throw(0);
    }
    if (n < 2) {
      vm_val_t::set_nil(&local_40);
    }
    else {
      pvVar6 = CVmStack::get(1);
      local_40.typ = pvVar6->typ;
      local_40._4_4_ = *(undefined4 *)&pvVar6->field_0x4;
      local_40.val = pvVar6->val;
      if ((local_40.typ != VM_OBJ) && (local_40.typ != VM_NIL)) {
        err_throw(0);
      }
    }
    if (local_40.typ == VM_NIL) {
      local_48 = (CVmGramProdMem *)0x0;
    }
    else {
      iVar2 = CVmObjDict::is_dictionary_obj(0);
      if (iVar2 == 0) {
        err_throw(0);
      }
      local_48 = (CVmGramProdMem *)vm_objp(0);
    }
    get_ext((CVmObjGramProd *)in_RDI);
    pvVar7 = CVmGramProdMem::alloc
                       ((CVmGramProdMem *)
                        CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                        CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
    for (local_50 = 0; local_50 < iVar1; local_50 = local_50 + 1) {
      *(undefined8 *)((long)pvVar7 + (long)local_50 * 0x40 + 0x30) = 0;
      *(undefined8 *)((long)pvVar7 + (long)local_50 * 0x40 + 0x38) = 0;
      vm_val_t::ll_index(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      iVar2 = vm_val_t::is_listlike(in_stack_fffffffffffffea0);
      if ((iVar2 == 0) ||
         (iVar2 = vm_val_t::ll_length((vm_val_t *)
                                      CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98))
         , iVar2 < 0)) {
        err_throw(0);
      }
      vm_val_t::ll_index(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      vm_val_t::ll_index(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8,
                         (int)((ulong)in_stack_fffffffffffffea0 >> 0x20));
      if (local_c0 == 0xf) {
        *(ulong *)((long)pvVar7 + (long)local_50 * 0x40 + 0x10) = (ulong)in_stack_ffffffffffffff48;
      }
      else {
        *(undefined8 *)((long)pvVar7 + (long)local_50 * 0x40 + 0x10) = 0;
      }
      pcVar8 = vm_val_t::get_as_string(in_stack_fffffffffffffe88);
      if (pcVar8 == (char *)0x0) {
        *(undefined8 *)((long)pvVar7 + (long)local_50 * 0x40 + 0x18) = 0;
        *(undefined8 *)((long)pvVar7 + (long)local_50 * 0x40 + 0x20) = 0;
      }
      else {
        puVar9 = (undefined8 *)((long)pvVar7 + (long)local_50 * 0x40);
        *puVar9 = local_d0;
        puVar9[1] = local_c8;
        *(char **)((long)pvVar7 + (long)local_50 * 0x40 + 0x18) = pcVar8 + 2;
        sVar10 = vmb_get_len((char *)0x355556);
        *(size_t *)((long)pvVar7 + (long)local_50 * 0x40 + 0x20) = sVar10;
        pcVar8 = pcVar8 + 2;
        in_stack_fffffffffffffec0 = local_48;
        vmb_get_len((char *)0x35559f);
        uVar3 = calc_str_hash((CVmObjDict *)in_stack_fffffffffffffea8,in_stack_fffffffffffffea0,
                              (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98),
                              CONCAT44(in_stack_fffffffffffffe94,in_stack_fffffffffffffe90));
        *(uint *)((long)pvVar7 + (long)local_50 * 0x40 + 0x28) = uVar3;
        if (local_48 != (CVmGramProdMem *)0x0) {
          in_stack_ffffffffffffff10 = get_ext((CVmObjGramProd *)in_RDI);
          CVmObjDict::enum_word_props
                    (in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                     in_RDI,(char *)CONCAT44(iVar11,in_stack_fffffffffffffed0),(size_t)pcVar8);
        }
      }
    }
    get_ext((CVmObjGramProd *)in_RDI);
    element_count = &stack0xffffffffffffff88;
    dict_00 = (CVmObjDict *)0x0;
    enqueue_alts(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                 in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                 (CVmGramProdState *)CONCAT44(in_stack_ffffffffffffff4c,in_stack_ffffffffffffff48),
                 in_stack_ffffffffffffff80,in_stack_ffffffffffffff88,in_stack_ffffffffffffff90,
                 in_stack_ffffffffffffff98,(CVmObjDict *)CONCAT44(n,in_stack_ffffffffffffffa0));
    get_ext((CVmObjGramProd *)in_RDI);
    process_work_queue(in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,
                       (size_t)in_stack_fffffffffffffeb0,(CVmGramProdQueue *)local_48,dict_00);
    for (pCVar12 = in_stack_ffffffffffffff98; pCVar12 != (CVmGramProdMatch *)0x0;
        pCVar12 = *(CVmGramProdMatch **)&pCVar12->tok_match_result_) {
    }
    pvVar6 = local_20;
    vVar4 = CVmObjList::create(in_stack_fffffffffffffe94,(size_t)element_count);
    vm_val_t::set_obj(pvVar6,vVar4);
    vm_objp(0);
    CVmObjList::cons_clear((CVmObjList *)CONCAT44(in_stack_fffffffffffffe94,local_14));
    CVmStack::push(local_20);
    for (; in_stack_ffffffffffffff98 != (CVmGramProdMatch *)0x0;
        in_stack_ffffffffffffff98 =
             *(CVmGramProdMatch **)&in_stack_ffffffffffffff98->tok_match_result_) {
      vVar4 = CVmObjList::create(in_stack_fffffffffffffe94,(size_t)element_count);
      vm_val_t::set_obj((vm_val_t *)&stack0xfffffffffffffef0,vVar4);
      CVmStack::push((vm_val_t *)&stack0xfffffffffffffef0);
      vm_objp(0);
      CVmObjList::cons_clear((CVmObjList *)CONCAT44(in_stack_fffffffffffffe94,local_14));
      build_match_tree((CVmGramProdMatch *)in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,
                       in_stack_ffffffffffffff00,(vm_val_t *)in_stack_fffffffffffffef8.native_desc,
                       (size_t *)in_stack_fffffffffffffef0,(size_t *)in_stack_fffffffffffffee8);
      CVmStack::discard();
      CVmObjList::cons_set_element
                ((CVmObjList *)CONCAT44(in_stack_fffffffffffffe94,local_14),(size_t)element_count,
                 (vm_val_t *)0x35595d);
    }
    CVmStack::discard();
    CVmStack::discard(n);
  }
  return 1;
}

Assistant:

int CVmObjGramProd::getp_parse(VMG_ vm_obj_id_t self,
                               vm_val_t *retval, uint *argc)
{
    vm_val_t *tokval;
    vm_val_t dictval;
    CVmObjDict *dict;
    int tok_cnt;
    int i;
    vmgramprod_tok *tok;
    int orig_argc = (argc != 0 ? *argc : 0);
    CVmGramProdQueue queues;
    CVmObjList *lst;
    int succ_cnt;
    CVmGramProdMatchEntry *match;
    static CVmNativeCodeDesc desc(2);
    
    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* reset our memory pool */
    get_ext()->mem_->reset();

    /* clear the work queues */
    queues.clear();

    /* 
     *   get the tokenList argument and make sure it's a list; leave it on
     *   the stack for now so it remains reachable for the garbage
     *   collector 
     */
    tokval = G_stk->get(0);
    if (!tokval->is_listlike(vmg0_)
        || (tok_cnt = tokval->ll_length(vmg0_)) < 0)
        err_throw(VMERR_LIST_VAL_REQD);

    /* check for a dictionary argument */
    if (orig_argc >= 2)
    {
        /* get the dictionary argument */
        dictval = *G_stk->get(1);

        /* make sure it's an object or nil */
        if (dictval.typ != VM_OBJ && dictval.typ != VM_NIL)
            err_throw(VMERR_OBJ_VAL_REQD);
    }
    else
    {
        /* use a nil dictionary by default */
        dictval.set_nil();
    }

    /* get the dictionary object and check that it's really a dictionary */
    if (dictval.typ != VM_NIL)
    {
        /* if it's not a CVmObjDict object, it's the wrong type */
        if (!CVmObjDict::is_dictionary_obj(vmg_ dictval.val.obj))
        {
            /* wrong type - throw an error */
            err_throw(VMERR_INVAL_OBJ_TYPE);
        }

        /* get the VM object pointer */
        dict = (CVmObjDict *)vm_objp(vmg_ dictval.val.obj);
    }
    else
    {
        /* there's no dictionary object */
        dict = 0;
    }

    /* 
     *   For quick and easy access, make our own private copy of the token
     *   and type lists.  First, allocate an array of token structures.  
     */
    tok = (vmgramprod_tok *)get_ext()->mem_
          ->alloc(tok_cnt * sizeof(vmgramprod_tok));

    /* copy the token string references and types into our list */
    for (i = 0 ; i < tok_cnt ; ++i)
    {
        vm_val_t ele_val;
        vm_val_t tok_typ_val;
        vm_val_t tok_str_val;
        int subcnt;
        const char *tokstrp;

        /* presume we won't have any vocabulary properties for the word */
        tok[i].match_cnt_ = 0;
        tok[i].matches_ = 0;

        /* get this element from the list, and treat it as a list */
        tokval->ll_index(vmg_ &ele_val, i + 1);

        /* make sure the sub-val is a list */
        if (!ele_val.is_listlike(vmg0_)
            || (subcnt = ele_val.ll_length(vmg0_)) < 0)
            err_throw(VMERR_BAD_TYPE_BIF);

        /* 
         *   parse the token sublist: the first element is the token value,
         *   and the second element is the token type 
         */
        ele_val.ll_index(vmg_ &tok_str_val, 1);
        ele_val.ll_index(vmg_ &tok_typ_val, 2);

        /* use the value if it's an enumerator; if not, use zero */
        if (tok_typ_val.typ == VM_ENUM)
            tok[i].typ_ = tok_typ_val.val.enumval;
        else
            tok[i].typ_ = 0;

        /* get the token value as a string */
        tokstrp = tok_str_val.get_as_string(vmg0_);

        /* if it's a string, copy it; otherwise, ignore the value */
        if (tokstrp != 0)
        {
            /* remember the string value */
            tok[i].val_ = tok_str_val;

            /* point the token to the string */
            tok[i].txt_ = tokstrp + VMB_LEN;
            tok[i].len_ = vmb_get_len(tokstrp);

            /* calculate and store the token's hash value */
            tok[i].hash_ = calc_str_hash(
                vmg_ dict, &tok_str_val,
                tokstrp + VMB_LEN, vmb_get_len(tokstrp));
            
            /* 
             *   if we have a dictionary, enumerate the properties
             *   associated with the word 
             */
            if (dict != 0)
            {
                enum_props_ctx ctx;
                
                /* set up our callback context */
                ctx.ext = get_ext();
                ctx.cnt = 0;
                
                /* enumerate the properties */
                dict->enum_word_props(vmg_ &enum_props_cb, &ctx,
                                      &tok_str_val, tok[i].txt_, tok[i].len_);
                
                /* 
                 *   if we found any properties for the word, make a copy
                 *   for the token list 
                 */
                if (ctx.cnt != 0)
                {
                    /* allocate space for the list */
                    tok[i].match_cnt_ = ctx.cnt;
                    tok[i].matches_ =
                        (vmgram_match_info *)get_ext()->mem_
                        ->alloc(ctx.cnt * sizeof(vmgram_match_info));
                    
                    /* copy the list */
                    memcpy(tok[i].matches_, get_ext()->prop_enum_arr_,
                           ctx.cnt * sizeof(tok[i].matches_[0]));
                }
            }
        }
        else
        {
            /* it's not a string - use a null string value for this token */
            tok[i].txt_ = 0;
            tok[i].len_ = 0;
        }
    }

    /* enqueue a match state item for each of our alternatives */
    enqueue_alts(vmg_ get_ext()->mem_, tok, tok_cnt, 0, 0,
                 &queues, self, FALSE, 0, dict);

    /* process the work queue */
    process_work_queue(vmg_ get_ext()->mem_, tok, tok_cnt,
                       &queues, dict);

    /* count the entries in the success list */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_) ;

    /* allocate the return list */
    retval->set_obj(CVmObjList::create(vmg_ FALSE, succ_cnt));
    lst = (CVmObjList *)vm_objp(vmg_ retval->val.obj);

    /* initially clear the elements of the return list to nil */
    lst->cons_clear();

    /* push the list momentarily to protect it from garbage collection */
    G_stk->push(retval);

    /* set the elements */
    for (succ_cnt = 0, match = queues.success_list_ ; match != 0 ;
         ++succ_cnt, match = match->nxt_)
    {
        vm_val_t tree_val;
        vm_val_t tok_match_val;
        size_t first_tok;
        size_t last_tok;
        
        /* 
         *   Create a list to hold the token match list - this is a list of
         *   the dictionary's comparator's matchValue() results for the
         *   tokens that matched literals in the grammar rule.  We need a
         *   list with one element per token that we matched.
         *   
         *   We can't actually populate this list yet, but all we need for
         *   the moment are references to it.  So, create the list; we'll
         *   fill it in as we traverse the match to build the result tree.  
         */
        tok_match_val.set_obj(
            CVmObjList::create(vmg_ FALSE, match->tok_pos_));

        /* push the token match value list for gc protection */
        G_stk->push(&tok_match_val);

        /* clear it out */
        ((CVmObjList *)vm_objp(vmg_ tok_match_val.val.obj))->cons_clear();

        /* build the object tree for this success object */
        build_match_tree(vmg_ match->match_, tokval, &tok_match_val,
                         &tree_val, &first_tok, &last_tok);

        /* discard our token match list's gc protection stack entry */
        G_stk->discard();

        /* 
         *   add the match tree's root object to the main return list (note
         *   that this protects it from garbage collection by virtue of the
         *   main return list being protected from garbage collection) 
         */
        lst->cons_set_element(succ_cnt, &tree_val);
    }

    /* discard the gc protection */
    G_stk->discard();

    /* discard arguments */
    G_stk->discard(orig_argc);

    /* evaluation successful */
    return TRUE;
}